

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakebuiltins.cpp
# Opt level: O1

QString * __thiscall
QMakeEvaluator::filePathArg0
          (QString *__return_storage_ptr__,QMakeEvaluator *this,ProStringList *args)

{
  Data *pDVar1;
  
  ProString::toQString((args->super_QList<ProString>).d.ptr,&this->m_tmp1);
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  resolvePath(__return_storage_ptr__,this,&this->m_tmp1);
  pDVar1 = (__return_storage_ptr__->d).d;
  if ((pDVar1 == (Data *)0x0) ||
     (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QString::reallocData
              ((longlong)__return_storage_ptr__,(AllocationOption)(__return_storage_ptr__->d).size);
  }
  return __return_storage_ptr__;
}

Assistant:

QString QMakeEvaluator::filePathArg0(const ProStringList &args)
{
    ProStringRoUser u1(args.at(0), m_tmp1);
    QString fn = resolvePath(u1.str());
    fn.detach();
    return fn;
}